

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

int yaml_parser_remove_simple_key(yaml_parser_t *parser)

{
  yaml_simple_key_t *pyVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  pyVar1 = (parser->simple_keys).top;
  if ((pyVar1[-1].possible != 0) && (pyVar1[-1].required != 0)) {
    sVar2 = pyVar1[-1].mark.column;
    sVar3 = pyVar1[-1].mark.index;
    sVar4 = pyVar1[-1].mark.line;
    parser->error = YAML_SCANNER_ERROR;
    parser->context = "while scanning a simple key";
    (parser->context_mark).index = sVar3;
    (parser->context_mark).line = sVar4;
    (parser->context_mark).column = sVar2;
    parser->problem = "could not find expected \':\'";
    sVar2 = (parser->mark).line;
    (parser->problem_mark).index = (parser->mark).index;
    (parser->problem_mark).line = sVar2;
    (parser->problem_mark).column = (parser->mark).column;
    return 0;
  }
  pyVar1[-1].possible = 0;
  return 1;
}

Assistant:

static int
yaml_parser_remove_simple_key(yaml_parser_t *parser)
{
    yaml_simple_key_t *simple_key = parser->simple_keys.top-1;

    if (simple_key->possible)
    {
        /* If the key is required, it is an error. */

        if (simple_key->required) {
            return yaml_parser_set_scanner_error(parser,
                    "while scanning a simple key", simple_key->mark,
                    "could not find expected ':'");
        }
    }

    /* Remove the key from the stack. */

    simple_key->possible = 0;

    return 1;
}